

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O1

bc_error_t *
bc_error_parser(bc_error_type_t type,char *src,size_t src_len,size_t current,char *format,...)

{
  ulong uVar1;
  char cVar2;
  bool bVar3;
  char in_AL;
  char *pcVar4;
  ulong uVar5;
  char *__ptr;
  bc_error_t *pbVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  undefined8 in_R9;
  long lVar12;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_108;
  undefined1 local_e8 [40];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_c0 = in_R9;
  if (format == (char *)0x0) {
    pbVar6 = (bc_error_t *)bc_malloc(0x10);
    pbVar6->type = type;
    pcVar4 = bc_strdup("");
    pbVar6->msg = pcVar4;
  }
  else {
    local_108.reg_save_area = local_e8;
    local_108.overflow_arg_area = &stack0x00000008;
    local_108.gp_offset = 0x28;
    local_108.fp_offset = 0x30;
    pcVar4 = bc_strdup_vprintf(format,&local_108);
    if (src_len == 0) {
      lVar11 = 1;
      uVar5 = 0;
      uVar9 = 0;
      lVar12 = 1;
    }
    else {
      lVar12 = 1;
      uVar10 = 0;
      lVar11 = 1;
      uVar5 = 0;
      uVar8 = 0;
      do {
        cVar2 = src[uVar10];
        uVar9 = uVar8;
        if (uVar10 < current) {
          uVar1 = uVar10 + 1;
          if (uVar1 < src_len) {
            if (cVar2 == '\r') {
              if (src[uVar1] == '\n') {
LAB_00109034:
                lVar12 = lVar12 + 1;
                if (uVar10 + 2 < src_len) {
                  uVar5 = uVar10 + 2;
                }
                bVar3 = false;
                lVar11 = 1;
                uVar10 = uVar1;
                goto LAB_0010908e;
              }
              goto LAB_00109067;
            }
            if (cVar2 != '\n') goto LAB_00109089;
            if (src[uVar1] == '\r') goto LAB_00109034;
          }
          else {
LAB_00109067:
            if ((cVar2 != '\r') && (cVar2 != '\n')) {
LAB_00109089:
              lVar11 = lVar11 + 1;
              goto LAB_0010908c;
            }
          }
          lVar12 = lVar12 + 1;
          if (uVar1 < src_len) {
            uVar5 = uVar1;
          }
          bVar3 = false;
          lVar11 = 1;
        }
        else {
          bVar3 = true;
          uVar9 = uVar10;
          if ((cVar2 != '\n') && (cVar2 != '\r')) {
LAB_0010908c:
            bVar3 = false;
            uVar9 = uVar8;
          }
        }
LAB_0010908e:
      } while ((!bVar3) && (uVar10 = uVar10 + 1, uVar8 = uVar9, uVar10 < src_len));
    }
    uVar8 = src_len;
    if (uVar5 < uVar9) {
      uVar8 = uVar9;
    }
    if (src_len < uVar5) {
      uVar8 = uVar9;
    }
    __ptr = bc_strndup(src + uVar5,uVar8 - uVar5);
    if (*__ptr == '\0') {
      pbVar6 = (bc_error_t *)bc_malloc(0x10);
      pbVar6->type = type;
      pcVar7 = bc_strdup(pcVar4);
      pbVar6->msg = pcVar7;
    }
    else {
      pbVar6 = bc_error_new_printf(type,"%s\nError occurred near line %d, position %d: %s",pcVar4,
                                   lVar12,lVar11,__ptr);
    }
    free(pcVar4);
    free(__ptr);
  }
  return pbVar6;
}

Assistant:

bc_error_t*
bc_error_parser(bc_error_type_t type, const char *src, size_t src_len,
    size_t current, const char *format, ...)
{
    if (format == NULL)
        return bc_error_new(type, "");
    va_list ap;
    va_start(ap, format);
    char *msg = bc_strdup_vprintf(format, ap);
    va_end(ap);

    size_t lineno = 1;
    size_t linestart = 0;
    size_t lineend = 0;
    size_t pos = 1;

    for (size_t i = 0; i < src_len; i++) {
        char c = src[i];
        if (i < current) {
            if ((i + 1) < src_len) {
                if ((c == '\n' && src[i + 1] == '\r') ||
                    (c == '\r' && src[i + 1] == '\n'))
                {
                    lineno++;
                    i++;
                    pos = 1;
                    if ((i + 1) < src_len)
                        linestart = i + 1;
                    continue;
                }
            }
            if (c == '\n' || c == '\r') {
                lineno++;
                pos = 1;
                if ((i + 1) < src_len)
                    linestart = i + 1;
                continue;
            }
            pos++;
        }
        else if (c == '\n' || c == '\r') {
            lineend = i;
            break;
        }
    }

    if (lineend <= linestart && src_len >= linestart)
        lineend = src_len;

    char *line = bc_strndup(src + linestart, lineend - linestart);

    bc_error_t *rv = NULL;

    if (line[0] == '\0')  // "near" message isn't useful if line is empty
        rv = bc_error_new(type, msg);
    else
        rv = bc_error_new_printf(type,
            "%s\nError occurred near line %d, position %d: %s", msg, lineno,
            pos, line);

    free(msg);
    free(line);

    return rv;
}